

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

int xmlSwitchInputEncodingInt
              (xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlCharEncodingHandlerPtr handler,
              int len)

{
  unsigned_long *puVar1;
  xmlParserInputBufferPtr pxVar2;
  xmlCharEncodingHandler *handler_00;
  char *__s1;
  xmlChar *pxVar3;
  int iVar4;
  xmlBufPtr pxVar5;
  size_t sVar6;
  size_t sVar7;
  
  iVar4 = -1;
  if (input != (xmlParserInputPtr)0x0 && handler != (xmlCharEncodingHandlerPtr)0x0) {
    pxVar2 = input->buf;
    if (pxVar2 == (xmlParserInputBufferPtr)0x0) {
      xmlErrInternal(ctxt,"static memory buffer doesn\'t support encoding\n",(xmlChar *)0x0);
      xmlCharEncCloseFunc(handler);
    }
    else {
      ctxt->charset = 1;
      handler_00 = pxVar2->encoder;
      if (handler_00 == (xmlCharEncodingHandler *)0x0) {
        pxVar2->encoder = handler;
        iVar4 = xmlBufIsEmpty(pxVar2->buffer);
        if (iVar4 == 0) {
          __s1 = handler->name;
          if (__s1 != (char *)0x0) {
            iVar4 = strcmp(__s1,"UTF-16LE");
            if ((((iVar4 == 0) || (iVar4 = strcmp(__s1,"UTF-16"), iVar4 == 0)) &&
                (pxVar3 = input->cur, *pxVar3 == 0xff)) && (pxVar3[1] == 0xfe)) {
              input->cur = pxVar3 + 2;
            }
            if (__s1 != (char *)0x0) {
              iVar4 = strcmp(__s1,"UTF-16BE");
              if (((iVar4 == 0) && (pxVar3 = input->cur, *pxVar3 == 0xfe)) && (pxVar3[1] == 0xff)) {
                input->cur = pxVar3 + 2;
              }
              if (((__s1 != (char *)0x0) && (iVar4 = strcmp(__s1,"UTF-8"), iVar4 == 0)) &&
                 ((pxVar3 = input->cur, *pxVar3 == 0xef &&
                  ((pxVar3[1] == 0xbb && (pxVar3[2] == 0xbf)))))) {
                input->cur = pxVar3 + 3;
              }
            }
          }
          sVar7 = (size_t)(*(int *)&input->cur - *(int *)&input->base);
          xmlBufShrink(input->buf->buffer,sVar7);
          input->buf->raw = input->buf->buffer;
          pxVar5 = xmlBufCreate();
          pxVar2 = input->buf;
          pxVar2->buffer = pxVar5;
          pxVar2->rawconsumed = sVar7;
          sVar7 = xmlBufUse(pxVar2->raw);
          if (ctxt->html == 0) {
            iVar4 = xmlCharEncFirstLineInput(input->buf,len);
          }
          else {
            iVar4 = xmlCharEncInput(input->buf,1);
          }
          xmlBufResetInput(input->buf->buffer,input);
          if (iVar4 < 0) {
            xmlErrInternal(ctxt,"switching encoding: encoder error\n",(xmlChar *)0x0);
            return -1;
          }
          sVar6 = xmlBufUse(input->buf->raw);
          puVar1 = &input->buf->rawconsumed;
          *puVar1 = *puVar1 + ((sVar7 & 0xffffffff) - sVar6);
        }
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        if (handler_00 != handler) {
          xmlCharEncCloseFunc(handler_00);
          input->buf->encoder = handler;
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int
xmlSwitchInputEncodingInt(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                          xmlCharEncodingHandlerPtr handler, int len)
{
    int nbchars;

    if (handler == NULL)
        return (-1);
    if (input == NULL)
        return (-1);
    if (input->buf != NULL) {
	ctxt->charset = XML_CHAR_ENCODING_UTF8;

        if (input->buf->encoder != NULL) {
            /*
             * Check in case the auto encoding detection triggered
             * in already.
             */
            if (input->buf->encoder == handler)
                return (0);

            /*
             * "UTF-16" can be used for both LE and BE
             if ((!xmlStrncmp(BAD_CAST input->buf->encoder->name,
             BAD_CAST "UTF-16", 6)) &&
             (!xmlStrncmp(BAD_CAST handler->name,
             BAD_CAST "UTF-16", 6))) {
             return(0);
             }
             */

            /*
             * Note: this is a bit dangerous, but that's what it
             * takes to use nearly compatible signature for different
             * encodings.
             *
             * FIXME: Encoders might buffer partial byte sequences, so
             * this probably can't work. We should return an error and
             * make sure that callers never try to switch the encoding
             * twice.
             */
            xmlCharEncCloseFunc(input->buf->encoder);
            input->buf->encoder = handler;
            return (0);
        }
        input->buf->encoder = handler;

        /*
         * Is there already some content down the pipe to convert ?
         */
        if (xmlBufIsEmpty(input->buf->buffer) == 0) {
            int processed;
	    unsigned int use;

            /*
             * Specific handling of the Byte Order Mark for
             * UTF-16
             */
            if ((handler->name != NULL) &&
                (!strcmp(handler->name, "UTF-16LE") ||
                 !strcmp(handler->name, "UTF-16")) &&
                (input->cur[0] == 0xFF) && (input->cur[1] == 0xFE)) {
                input->cur += 2;
            }
            if ((handler->name != NULL) &&
                (!strcmp(handler->name, "UTF-16BE")) &&
                (input->cur[0] == 0xFE) && (input->cur[1] == 0xFF)) {
                input->cur += 2;
            }
            /*
             * Errata on XML-1.0 June 20 2001
             * Specific handling of the Byte Order Mark for
             * UTF-8
             */
            if ((handler->name != NULL) &&
                (!strcmp(handler->name, "UTF-8")) &&
                (input->cur[0] == 0xEF) &&
                (input->cur[1] == 0xBB) && (input->cur[2] == 0xBF)) {
                input->cur += 3;
            }

            /*
             * Shrink the current input buffer.
             * Move it as the raw buffer and create a new input buffer
             */
            processed = input->cur - input->base;
            xmlBufShrink(input->buf->buffer, processed);
            input->buf->raw = input->buf->buffer;
            input->buf->buffer = xmlBufCreate();
	    input->buf->rawconsumed = processed;
	    use = xmlBufUse(input->buf->raw);

            if (ctxt->html) {
                /*
                 * convert as much as possible of the buffer
                 */
                nbchars = xmlCharEncInput(input->buf, 1);
            } else {
                /*
                 * convert just enough to get
                 * '<?xml version="1.0" encoding="xxx"?>'
                 * parsed with the autodetected encoding
                 * into the parser reading buffer.
                 */
                nbchars = xmlCharEncFirstLineInput(input->buf, len);
            }
            xmlBufResetInput(input->buf->buffer, input);
            if (nbchars < 0) {
                xmlErrInternal(ctxt,
                               "switching encoding: encoder error\n",
                               NULL);
                return (-1);
            }
	    input->buf->rawconsumed += use - xmlBufUse(input->buf->raw);
        }
        return (0);
    } else {
	xmlErrInternal(ctxt,
                "static memory buffer doesn't support encoding\n", NULL);
        /*
         * Callers assume that the input buffer takes ownership of the
         * encoding handler. xmlCharEncCloseFunc frees unregistered
         * handlers and avoids a memory leak.
         */
        xmlCharEncCloseFunc(handler);
	return (-1);
    }
}